

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

Encoding ON_String::ProbableEncoding(char *buffer,int buffer_length)

{
  bool bVar1;
  undefined4 local_1c;
  int buffer_length_local;
  char *buffer_local;
  
  if (buffer == (char *)0x0) {
    buffer_local._4_4_ = Unknown;
  }
  else {
    local_1c = buffer_length;
    if (buffer_length == -1) {
      local_1c = Length(buffer);
    }
    if (local_1c < 1) {
      buffer_local._4_4_ = Unknown;
    }
    else {
      bVar1 = IsPossibleEncoding(ASCII,buffer,local_1c);
      if (bVar1) {
        buffer_local._4_4_ = ASCII;
      }
      else {
        bVar1 = IsPossibleEncoding(UTF8,buffer,local_1c);
        if (bVar1) {
          buffer_local._4_4_ = UTF8;
        }
        else {
          bVar1 = IsPossibleEncoding(BIG5andASCII,buffer,local_1c);
          if (bVar1) {
            buffer_local._4_4_ = BIG5andASCII;
          }
          else {
            bVar1 = IsPossibleEncoding(SloppyUTF8,buffer,local_1c);
            if (bVar1) {
              buffer_local._4_4_ = SloppyUTF8;
            }
            else {
              buffer_local._4_4_ = Unknown;
            }
          }
        }
      }
    }
  }
  return buffer_local._4_4_;
}

Assistant:

ON_String::Encoding ON_String::ProbableEncoding(
  const char* buffer,
  int buffer_length
)
{
  if (nullptr == buffer)
    return ON_String::Encoding::Unknown;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);

  if (buffer_length <= 0)
    return ON_String::Encoding::Unknown;

  if (ON_String::IsPossibleEncoding(ON_String::Encoding::ASCII, buffer, buffer_length))
    return ON_String::Encoding::ASCII;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::UTF8, buffer, buffer_length))
    return ON_String::Encoding::UTF8;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::BIG5andASCII, buffer, buffer_length))
    return ON_String::Encoding::BIG5andASCII;
  if (ON_String::IsPossibleEncoding(ON_String::Encoding::SloppyUTF8, buffer, buffer_length))
    return ON_String::Encoding::SloppyUTF8;

  return ON_String::Encoding::Unknown;
}